

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
          ScratchAllocator *alloc,DynamicStateInfo *dynamic_state_info)

{
  VkSampleLocationEXT *pVVar1;
  byte local_71;
  undefined4 local_68 [10];
  Impl *local_40;
  VkPipelineSampleLocationsStateCreateInfoEXT *sample_locations;
  DynamicStateInfo *pDStack_30;
  bool dynamic_enable;
  DynamicStateInfo *dynamic_state_info_local;
  ScratchAllocator *alloc_local;
  VkPipelineSampleLocationsStateCreateInfoEXT *create_info_local;
  Impl *this_local;
  
  if ((create_info->sampleLocationsInfo).pNext == (void *)0x0) {
    local_71 = 0;
    if (dynamic_state_info != (DynamicStateInfo *)0x0) {
      local_71 = dynamic_state_info->sample_locations_enable;
    }
    sample_locations._7_1_ = local_71 & 1;
    pDStack_30 = dynamic_state_info;
    dynamic_state_info_local = (DynamicStateInfo *)alloc;
    alloc_local = (ScratchAllocator *)create_info;
    create_info_local = (VkPipelineSampleLocationsStateCreateInfoEXT *)this;
    local_40 = (Impl *)copy<VkPipelineSampleLocationsStateCreateInfoEXT>(this,create_info,1,alloc);
    if (((pDStack_30 == (DynamicStateInfo *)0x0) || ((pDStack_30->sample_locations & 1U) != 0)) ||
       ((*(VkBool32 *)&(local_40->ycbcr_temp_allocator).impl == 0 &&
        ((sample_locations._7_1_ & 1) == 0)))) {
      memset(local_68,0,0x28);
      local_68[0] = 0x3b9cf898;
      memcpy((VkSampleLocationsInfoEXT *)&local_40->database_iface,local_68,0x28);
    }
    else {
      pVVar1 = copy<VkSampleLocationEXT>
                         (this,*(VkSampleLocationEXT **)&local_40->should_record_identifier_only,
                          (ulong)*(uint *)((long)&local_40->application_info_filter + 4),
                          (ScratchAllocator *)dynamic_state_info_local);
      *(VkSampleLocationEXT **)&local_40->should_record_identifier_only = pVVar1;
    }
    this_local = local_40;
  }
  else {
    this_local = (Impl *)0x0;
  }
  return this_local;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineSampleLocationsStateCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	// This is only a thing for VkImageMemoryBarrier pNext.
	if (create_info->sampleLocationsInfo.pNext)
		return nullptr;

	bool dynamic_enable = dynamic_state_info && dynamic_state_info->sample_locations_enable;
	auto *sample_locations = copy(create_info, 1, alloc);
	if (dynamic_state_info && !dynamic_state_info->sample_locations &&
	    (sample_locations->sampleLocationsEnable || dynamic_enable))
	{
		sample_locations->sampleLocationsInfo.pSampleLocations =
				copy(sample_locations->sampleLocationsInfo.pSampleLocations,
				     sample_locations->sampleLocationsInfo.sampleLocationsCount, alloc);
	}
	else
	{
		// Otherwise, ignore the location info.
		// Either it's dynamic, or ignored due to sampleLocationsEnable being VK_FALSE.
		sample_locations->sampleLocationsInfo = { VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT };
	}

	return sample_locations;
}